

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O2

void __thiscall
iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_>::Body
          (iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_> *this)

{
  iuCodeMessage local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  iuStreamMessage local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::GetTypeName<int>();
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_1b0);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
             ,0x62,"Succeeded.\n");
  local_200._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1b0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  iutest::detail::GetTypeName<float>();
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_1d0);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
             ,99,"Succeeded.\n");
  local_200._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_200,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  return;
}

Assistant:

IUTEST_TYPED_TEST(MultiTypedTest, Get)
{
    typedef typename TypeParam:: template get<0>::type  Type1;
    typedef typename TypeParam:: template get<1>::type  Type2;

#if IUTEST_HAS_STATIC_ASSERT_TYPEEQ
    ::iutest::StaticAssertTypeEq< Type1, int >();
#endif
    IUTEST_SUCCEED() << ::iutest::detail::GetTypeNameProxy< Type1 >::GetTypeName();
    IUTEST_SUCCEED() << ::iutest::detail::GetTypeNameProxy< Type2 >::GetTypeName();
}